

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

TValue * trace_state(lua_State *L,lua_CFunction dummy,void *ud)

{
  byte *pbVar1;
  global_State *g;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  lua_State *plVar5;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar6;
  char *pcVar7;
  TValue *pTVar8;
  uint64_t uVar9;
  undefined8 *puVar10;
  int *piVar11;
  long lVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  uint uVar15;
  BCPos BVar16;
  ushort *puVar17;
  uint64_t uVar18;
  ptrdiff_t pVar19;
  GCstr *pGVar20;
  cTValue *nextframe;
  long lVar21;
  long lVar22;
  int iVar23;
  undefined8 *puVar24;
  undefined8 *puVar25;
  void *__dest;
  ulong uVar26;
  GCfunc *fn;
  TValue *pTVar27;
  byte bVar28;
  double dVar29;
  int local_34;
  
  bVar28 = 0;
  g = (global_State *)((long)ud + -0x2e0);
LAB_001185d2:
  switch(*(undefined4 *)((long)ud + 0xec)) {
  case 0x11:
    goto switchD_001185eb_caseD_11;
  case 0x12:
switchD_001185eb_caseD_12:
    *(undefined4 *)((long)ud + 0xec) = 0x11;
    goto switchD_001185eb_caseD_11;
  case 0x13:
    *(undefined4 *)((long)ud + 0xec) = 0x11;
    trace_start((jit_State *)ud);
    lj_dispatch_update(g);
    uVar15 = *(uint *)((long)ud + 0xec);
    if (uVar15 == 0x12) goto switchD_001185eb_caseD_12;
    break;
  case 0x14:
    if (*(undefined4 **)((long)ud + 0xbd8) != (undefined4 *)0x0) {
      **(undefined4 **)((long)ud + 0xbd8) = *(undefined4 *)((long)ud + 0xbe0);
      *(undefined8 *)((long)ud + 0xbd8) = 0;
    }
    *(undefined4 *)((long)ud + 0x158) = 0;
    if ((((*(byte *)((long)ud + 0xaa) & 0x40) != 0) &&
        (*(short *)((long)ud + 0x6a) == *(short *)((long)ud + 0x68))) &&
       (*(int *)((long)ud + 0xfc) + *(int *)((long)ud + 0x100) == 0)) {
      *(undefined4 *)((long)ud + -0x228) = 0xfffffffa;
      lj_opt_dce((jit_State *)ud);
      iVar23 = lj_opt_loop((jit_State *)ud);
      if (iVar23 != 0) {
        *(undefined2 *)((long)ud + 0x6a) = 0;
        *(undefined1 *)((long)ud + 0x74) = 0;
        *(undefined4 *)((long)ud + 0x158) = *(undefined4 *)((long)ud + 0xc);
        *(undefined4 *)((long)ud + 0xec) = 0x11;
        return (TValue *)0x0;
      }
      *(uint *)((long)ud + 0x158) = (uint)*(ushort *)((long)ud + 0x1b4);
    }
    lj_opt_sink((jit_State *)ud);
    if (*(int *)((long)ud + 0x158) == 0) {
      *(undefined1 *)(*(long *)((long)ud + 0x30) + -1 + (ulong)*(ushort *)((long)ud + 10) * 0xc) =
           0xff;
    }
    *(undefined4 *)((long)ud + 0xec) = 0x15;
    uVar15 = 0x15;
    break;
  case 0x15:
    *(undefined4 *)((long)ud + -0x228) = 0xfffffff9;
    lj_asm_trace((jit_State *)ud,(GCtrace *)ud);
    uVar15 = *(uint *)((long)ud + 0x50);
    uVar2 = *(ushort *)((long)ud + 0x68);
    puVar10 = *(undefined8 **)((long)ud + 0x78);
    if (0x18 < (uVar15 & 0xff) - 0x41) goto switchD_00118c40_caseD_43;
    lVar21 = *(long *)((long)ud + 0x40);
    piVar11 = *(int **)((long)ud + 0x48);
    switch(uVar15 & 0xff) {
    case 0x41:
    case 0x42:
    case 0x45:
      *(ushort *)
       (*(long *)(*(long *)((long)ud + 0x180) + (ulong)*(uint *)((long)ud + 0xbcc) * 8) + 0x6a) =
           uVar2;
      break;
    case 0x46:
    case 0x4a:
    case 0x4b:
    case 0x4c:
      *piVar11 = (uint)*(byte *)(*(long *)((long)ud + 0x30) + 8) * 0x100 + (uint)uVar2 * 0x10000 +
                 0x57;
      goto LAB_00118cab;
    case 0x4f:
      *(char *)(piVar11 + ((ulong)(uVar15 >> 0x10) - 0x8000)) = 'N';
    case 0x52:
    case 0x55:
    case 0x59:
      *(char *)piVar11 = (char)uVar15 + '\x02';
      *(ushort *)((long)piVar11 + 2) = uVar2;
LAB_00118cab:
      *(undefined2 *)((long)ud + 0x6e) = *(undefined2 *)(lVar21 + 0x3e);
      *(ushort *)(lVar21 + 0x3e) = uVar2;
      break;
    case 0x58:
      lj_asm_patchexit((jit_State *)ud,
                       *(GCtrace **)
                        (*(long *)((long)ud + 0x180) + (ulong)*(uint *)((long)ud + 0xbc8) * 8),
                       *(ExitNo *)((long)ud + 0xbcc),*(MCode **)((long)ud + 0x58));
      lVar21 = *(long *)((long)ud + 0x180);
      lVar12 = *(long *)(*(long *)(lVar21 + (ulong)*(uint *)((long)ud + 0xbc8) * 8) + 0x30);
      lVar22 = (ulong)*(uint *)((long)ud + 0xbcc) * 0xc;
      *(undefined1 *)(lVar12 + 0xb + lVar22) = 0xff;
      if (*(byte *)(lVar12 + 9 + lVar22) < *(byte *)((long)ud + 0x73)) {
        *(byte *)(lVar12 + lVar22 + 9) = *(byte *)((long)ud + 0x73);
      }
      lVar21 = *(long *)(lVar21 + (ulong)*(ushort *)((long)ud + 0x6c) * 8);
      *(short *)(lVar21 + 100) = *(short *)(lVar21 + 100) + 1;
      *(undefined2 *)((long)ud + 0x70) = *(undefined2 *)(lVar21 + 0x70);
      *(ushort *)(lVar21 + 0x70) = uVar2;
    }
switchD_00118c40_caseD_43:
    lj_mcode_commit((jit_State *)ud,*(MCode **)((long)ud + 0x58));
    *(undefined4 *)((long)ud + 0x174) = 0;
    iVar23 = *(int *)((long)ud + 0xc);
    iVar4 = *(int *)((long)ud + 0x28);
    puVar24 = (undefined8 *)ud;
    puVar25 = puVar10;
    for (lVar21 = 0xf; lVar21 != 0; lVar21 = lVar21 + -1) {
      *puVar25 = *puVar24;
      puVar24 = puVar24 + (ulong)bVar28 * -2 + 1;
      puVar25 = puVar25 + (ulong)bVar28 * -2 + 1;
    }
    *puVar10 = *(undefined8 *)((long)ud + -0x2b8);
    *(undefined8 **)((long)ud + -0x2b8) = puVar10;
    *(byte *)(puVar10 + 1) = *(byte *)((long)ud + -0x2c0) & 3;
    *(undefined1 *)((long)puVar10 + 9) = 9;
    puVar10[4] = puVar10 + (0xf - (ulong)*(uint *)((long)ud + 0x28));
    puVar24 = puVar10 + (ulong)(uint)(iVar23 - iVar4) + 0xf;
    puVar10[6] = puVar24;
    memcpy(puVar24,*(void **)((long)ud + 0x30),(ulong)*(ushort *)((long)ud + 10) * 0xc);
    __dest = (void *)((ulong)*(ushort *)((long)ud + 10) * 0xc + (long)puVar24);
    puVar10[7] = __dest;
    memcpy(__dest,*(void **)((long)ud + 0x38),(ulong)*(uint *)((long)ud + 0x2c) << 2);
    *(undefined2 *)((long)ud + 0x68) = 0;
    *(undefined8 *)((long)ud + 0x78) = 0;
    uVar3 = *(ushort *)(puVar10 + 0xd);
    *(undefined8 **)(*(long *)((long)ud + 0x180) + (ulong)uVar3 * 8) = puVar10;
    lj_gc_barriertrace(g,(uint)uVar3);
    plVar5 = *(lua_State **)((long)ud + 0x80);
    if (((*(byte *)((plVar5->glref).ptr64 + 0x93) & 2) != 0) &&
       (pVar19 = lj_vmevent_prepare(plVar5,LJ_VMEVENT_TRACE), pVar19 != 0)) {
      pTVar27 = plVar5->top;
      plVar5->top = pTVar27 + 1;
      pGVar20 = lj_str_new(plVar5,"stop",4);
      pTVar27->u64 = (ulong)pGVar20 | 0xfffd800000000000;
      pTVar27 = plVar5->top;
      plVar5->top = pTVar27 + 1;
      pTVar27->n = (double)uVar2;
      pTVar27 = plVar5->top;
      plVar5->top = pTVar27 + 1;
      pTVar27->u64 = *(ulong *)((long)ud + 0x90) | 0xfffb800000000000;
      lj_vmevent_call(plVar5,pVar19);
    }
    *(undefined4 *)((long)ud + -0x228) = 0xffffffff;
    *(undefined4 *)((long)ud + 0xec) = 0;
LAB_00118be0:
    lj_dispatch_update(g);
    return (TValue *)0x0;
  case 0x16:
    goto switchD_001185eb_caseD_16;
  default:
    pTVar27 = L->top;
    L->top = pTVar27 + 1;
    pTVar27->u64 = 0;
switchD_001185eb_caseD_16:
    if (*(undefined4 **)((long)ud + 0xbd8) != (undefined4 *)0x0) {
      **(undefined4 **)((long)ud + 0xbd8) = *(undefined4 *)((long)ud + 0xbe0);
      *(undefined8 *)((long)ud + 0xbd8) = 0;
    }
    plVar5 = *(lua_State **)((long)ud + 0x80);
    *(undefined4 *)((long)ud + 0x174) = 0;
    lj_mcode_abort((jit_State *)ud);
    if (*(GCtrace **)((long)ud + 0x78) != (GCtrace *)0x0) {
      lj_trace_free(g,*(GCtrace **)((long)ud + 0x78));
      *(undefined8 *)((long)ud + 0x78) = 0;
    }
    aVar6 = plVar5->top[-1].field_4;
    iVar23 = 0;
    if ((0x1fff2 < aVar6.it >> 0xf) || (iVar23 = (int)(double)aVar6, iVar23 != 0x1d)) {
      if ((*(int *)((long)ud + 0xbc8) == 0) && (*(byte *)((long)ud + 0x50) - 0x4d < 0xfffffffc)) {
        uVar15 = *(uint *)((long)ud + 0xbcc);
        if ((ulong)uVar15 == 0) {
          pcVar7 = *(char **)((long)ud + 0x48);
          if (iVar23 == 6) {
            *(undefined2 *)((long)ud + (ulong)((int)pcVar7 + 4U >> 1 & 0x7e) + 0xc48) = 1;
          }
          else {
            lVar21 = *(long *)((long)ud + 0x40);
            puVar17 = (ushort *)((long)ud + 0x728);
            for (uVar26 = 0; uVar26 != 0x40; uVar26 = uVar26 + 1) {
              if (*(char **)(puVar17 + -4) == pcVar7) {
                uVar2 = *puVar17;
                uVar18 = lj_prng_u64((PRNGState *)((long)ud + 0xc28));
                uVar15 = ((uint)uVar18 & 0xf) + (uint)uVar2 * 2;
                if (uVar15 < 0xea61) goto LAB_00118950;
                if (*pcVar7 == 'F') {
                  *pcVar7 = 'E';
                  pcVar7[(ulong)*(ushort *)(pcVar7 + 6) * 4 + -0x1fffc] = 'X';
                }
                else {
                  *pcVar7 = *pcVar7 + '\x01';
                  pbVar1 = (byte *)(lVar21 + 0x3d);
                  *pbVar1 = *pbVar1 | 0x10;
                }
                goto LAB_00118979;
              }
              puVar17 = puVar17 + 8;
            }
            uVar26 = (ulong)*(uint *)((long)ud + 0xb20);
            *(uint *)((long)ud + 0xb20) = *(uint *)((long)ud + 0xb20) + 1 & 0x3f;
            *(char **)((long)ud + uVar26 * 0x10 + 0x720) = pcVar7;
            uVar15 = 0x48;
LAB_00118950:
            *(short *)((long)ud + uVar26 * 0x10 + 0x728) = (short)uVar15;
            *(short *)((long)ud + uVar26 * 0x10 + 0x72a) = (short)iVar23;
            *(short *)((long)ud + (ulong)((int)pcVar7 + 4U >> 1 & 0x7e) + 0xc48) = (short)uVar15;
          }
        }
        else {
          *(short *)(*(long *)(*(long *)((long)ud + 0x180) + (ulong)uVar15 * 8) + 0x6a) =
               (short)uVar15;
        }
      }
LAB_00118979:
      uVar2 = *(ushort *)((long)ud + 0x68);
      pTVar27 = plVar5->top;
      if (uVar2 != 0) {
        uVar18 = (plVar5->stack).ptr64;
        *(undefined2 *)((long)ud + 0x6a) = 0;
        *(undefined1 *)((long)ud + 0x74) = 0;
        if (((*(byte *)((plVar5->glref).ptr64 + 0x93) & 2) != 0) &&
           (pVar19 = lj_vmevent_prepare(plVar5,LJ_VMEVENT_TRACE), pVar19 != 0)) {
          pTVar8 = plVar5->top;
          plVar5->top = pTVar8 + 1;
          pGVar20 = lj_str_new(plVar5,"abort",5);
          pTVar8->u64 = (ulong)pGVar20 | 0xfffd800000000000;
          pTVar8 = plVar5->top;
          plVar5->top = pTVar8 + 1;
          pTVar8->n = (double)uVar2;
          nextframe = lj_debug_frame(plVar5,0,&local_34);
          fn = (GCfunc *)(nextframe[-1].u64 & 0x7fffffffffff);
          if ((nextframe == plVar5->base + -1) && ((fn->c).ffid == '\0')) {
            BVar16 = (BCPos)(*(long *)((long)ud + 0x88) - (fn->c).pc.ptr64 >> 2);
          }
          else {
            BVar16 = lj_debug_framepc(plVar5,fn,nextframe);
          }
          pTVar8 = plVar5->top;
          plVar5->top = pTVar8 + 1;
          pTVar8->u64 = (ulong)fn | 0xfffb800000000000;
          pTVar8 = plVar5->top;
          plVar5->top = pTVar8 + 1;
          pTVar8->n = (double)(int)BVar16;
          pTVar8 = plVar5->top;
          uVar9 = (plVar5->stack).ptr64;
          plVar5->top = pTVar8 + 1;
          *pTVar8 = *(TValue *)((long)pTVar27 + uVar9 + (-8 - uVar18));
          pTVar27 = plVar5->top;
          plVar5->top = pTVar27 + 1;
          *pTVar27 = *(TValue *)((long)ud + 0xc10);
          lj_vmevent_call(plVar5,pVar19);
        }
        *(undefined8 *)(*(long *)((long)ud + 0x180) + (ulong)(uint)uVar2 * 8) = 0;
        if ((uint)uVar2 < *(uint *)((long)ud + 0x188)) {
          *(uint *)((long)ud + 0x188) = (uint)uVar2;
        }
        *(undefined2 *)((long)ud + 0x68) = 0;
        pTVar27 = plVar5->top;
      }
      plVar5->top = pTVar27 + -1;
      if (iVar23 == 0xe) {
        if (**(char **)((long)ud + 0x88) != 'I') {
          *(undefined8 *)((long)ud + 0xbc8) = 0;
          *(undefined4 *)((long)ud + 0xec) = 0x11;
          trace_start((jit_State *)ud);
          goto LAB_001185d2;
        }
      }
      else if (iVar23 == 0x1b) {
        lj_trace_flushall(plVar5);
      }
      *(undefined4 *)((long)ud + -0x228) = 0xffffffff;
      *(undefined4 *)((long)ud + 0xec) = 0;
      goto LAB_00118be0;
    }
    plVar5->top = plVar5->top + -1;
    *(undefined4 *)((long)ud + 0xec) = 0x15;
    goto LAB_001185d2;
  }
LAB_001187bc:
  if (uVar15 < 0x12) {
    return (TValue *)0x0;
  }
  goto LAB_001185d2;
switchD_001185eb_caseD_11:
  if (*(undefined4 **)((long)ud + 0xbd8) != (undefined4 *)0x0) {
    if (*(char *)((long)ud + 0xb7) == '\0') {
      **(undefined4 **)((long)ud + 0xbd8) = *(undefined4 *)((long)ud + 0xbe0);
      *(undefined8 *)((long)ud + 0xbd8) = 0;
    }
    else {
      *(undefined1 *)((long)ud + 0xb7) = 0;
    }
  }
  *(undefined4 *)((long)ud + -0x228) = 0xfffffffb;
  if (((*(byte *)((L->glref).ptr64 + 0x93) & 4) != 0) &&
     (pVar19 = lj_vmevent_prepare(L,LJ_VMEVENT_RECORD), pVar19 != 0)) {
    uVar13 = *(undefined8 *)((long)ud + -0x1f8);
    uVar14 = *(undefined8 *)((long)ud + -0x1f0);
    pTVar27 = L->top;
    L->top = pTVar27 + 1;
    pTVar27->n = (double)*(ushort *)((long)ud + 0x68);
    pTVar27 = L->top;
    L->top = pTVar27 + 1;
    pTVar27->u64 = *(ulong *)((long)ud + 0x90) | 0xfffb800000000000;
    pTVar27 = L->top;
    L->top = pTVar27 + 1;
    dVar29 = -1.0;
    if (*(long *)((long)ud + 0x98) != 0) {
      dVar29 = (double)(int)((*(long *)((long)ud + 0x88) - *(long *)((long)ud + 0x98)) - 0x68U >> 2)
      ;
    }
    pTVar27->u64 = (uint64_t)dVar29;
    pTVar27 = L->top;
    L->top = pTVar27 + 1;
    pTVar27->n = (double)*(int *)((long)ud + 0xfc);
    lj_vmevent_call(L,pVar19);
    *(undefined8 *)((long)ud + -0x1f8) = uVar13;
    *(undefined8 *)((long)ud + -0x1f0) = uVar14;
  }
  lj_record_ins((jit_State *)ud);
  uVar15 = *(uint *)((long)ud + 0xec);
  goto LAB_001187bc;
}

Assistant:

static TValue *trace_state(lua_State *L, lua_CFunction dummy, void *ud)
{
  jit_State *J = (jit_State *)ud;
  UNUSED(dummy);
  do {
  retry:
    switch (J->state) {
    case LJ_TRACE_START:
      J->state = LJ_TRACE_RECORD;  /* trace_start() may change state. */
      trace_start(J);
      lj_dispatch_update(J2G(J));
      if (J->state != LJ_TRACE_RECORD_1ST)
	break;
      /* fallthrough */

    case LJ_TRACE_RECORD_1ST:
      J->state = LJ_TRACE_RECORD;
      /* fallthrough */
    case LJ_TRACE_RECORD:
      trace_pendpatch(J, 0);
      setvmstate(J2G(J), RECORD);
      lj_vmevent_send_(L, RECORD,
	/* Save/restore tmptv state for trace recorder. */
	TValue savetv = J2G(J)->tmptv;
	TValue savetv2 = J2G(J)->tmptv2;
	setintV(L->top++, J->cur.traceno);
	setfuncV(L, L->top++, J->fn);
	setintV(L->top++, J->pt ? (int32_t)proto_bcpos(J->pt, J->pc) : -1);
	setintV(L->top++, J->framedepth);
      ,
	J2G(J)->tmptv = savetv;
	J2G(J)->tmptv2 = savetv2;
      );
      lj_record_ins(J);
      break;

    case LJ_TRACE_END:
      trace_pendpatch(J, 1);
      J->loopref = 0;
      if ((J->flags & JIT_F_OPT_LOOP) &&
	  J->cur.link == J->cur.traceno && J->framedepth + J->retdepth == 0) {
	setvmstate(J2G(J), OPT);
	lj_opt_dce(J);
	if (lj_opt_loop(J)) {  /* Loop optimization failed? */
	  J->cur.link = 0;
	  J->cur.linktype = LJ_TRLINK_NONE;
	  J->loopref = J->cur.nins;
	  J->state = LJ_TRACE_RECORD;  /* Try to continue recording. */
	  break;
	}
	J->loopref = J->chain[IR_LOOP];  /* Needed by assembler. */
      }
      lj_opt_split(J);
      lj_opt_sink(J);
      if (!J->loopref) J->cur.snap[J->cur.nsnap-1].count = SNAPCOUNT_DONE;
      J->state = LJ_TRACE_ASM;
      break;

    case LJ_TRACE_ASM:
      setvmstate(J2G(J), ASM);
      lj_asm_trace(J, &J->cur);
      trace_stop(J);
      setvmstate(J2G(J), INTERP);
      J->state = LJ_TRACE_IDLE;
      lj_dispatch_update(J2G(J));
      return NULL;

    default:  /* Trace aborted asynchronously. */
      setintV(L->top++, (int32_t)LJ_TRERR_RECERR);
      /* fallthrough */
    case LJ_TRACE_ERR:
      trace_pendpatch(J, 1);
      if (trace_abort(J))
	goto retry;
      setvmstate(J2G(J), INTERP);
      J->state = LJ_TRACE_IDLE;
      lj_dispatch_update(J2G(J));
      return NULL;
    }
  } while (J->state > LJ_TRACE_RECORD);
  return NULL;
}